

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O0

void __thiscall
asio::detail::
io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
io_object_impl<asio::io_context>
          (io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           *this,int param_1,int param_2,io_context *context)

{
  reactive_socket_service<asio::ip::tcp> *prVar1;
  basic_executor_type<std::allocator<void>,_0U> local_30;
  io_context *local_20;
  io_context *context_local;
  int param_2_local;
  int param_1_local;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *this_local;
  
  local_20 = context;
  context_local._0_4_ = param_2;
  context_local._4_4_ = param_1;
  _param_2_local = this;
  prVar1 = use_service<asio::detail::reactive_socket_service<asio::ip::tcp>>(context);
  this->service_ = prVar1;
  reactive_socket_service<asio::ip::tcp>::implementation_type::implementation_type
            (&this->implementation_);
  io_context::get_executor((io_context *)&local_30);
  any_io_executor::any_io_executor<asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
            (&this->executor_,&local_30,0);
  io_context::basic_executor_type<std::allocator<void>,_0U>::~basic_executor_type(&local_30);
  reactive_socket_service_base::construct
            (&this->service_->super_reactive_socket_service_base,
             &(this->implementation_).super_base_implementation_type);
  return;
}

Assistant:

explicit io_object_impl(int, int, ExecutionContext& context)
    : service_(&asio::use_service<IoObjectService>(context)),
      executor_(context.get_executor())
  {
    service_->construct(implementation_);
  }